

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * __thiscall
google::protobuf::Arena::AllocateAlignedForArray(Arena *this,size_t n,size_t align)

{
  size_t n_00;
  void *ptr;
  ArenaAlign local_38;
  ArenaAlign align_as;
  size_t align_local;
  size_t n_local;
  Arena *this_local;
  
  align_as.align = align;
  if (align < 9) {
    this_local = (Arena *)AllocateForArray(this,n + 7 & 0xfffffffffffffff8);
  }
  else {
    local_38 = internal::ArenaAlignAs(align);
    n_00 = internal::ArenaAlign::Padded(&local_38,n);
    ptr = AllocateForArray(this,n_00);
    this_local = (Arena *)internal::ArenaAlign::Ceil<void>(&local_38,ptr);
  }
  return this_local;
}

Assistant:

void* PROTOBUF_NONNULL AllocateAlignedForArray(size_t n, size_t align) {
    if (align <= internal::ArenaAlignDefault::align) {
      return AllocateForArray(internal::ArenaAlignDefault::Ceil(n));
    } else {
      // We are wasting space by over allocating align - 8 bytes. Compared
      // to a dedicated function that takes current alignment in consideration.
      // Such a scheme would only waste (align - 8)/2 bytes on average, but
      // requires a dedicated function in the outline arena allocation
      // functions. Possibly re-evaluate tradeoffs later.
      auto align_as = internal::ArenaAlignAs(align);
      return align_as.Ceil(AllocateForArray(align_as.Padded(n)));
    }
  }